

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

RecGroup __thiscall wasm::anon_unknown_0::RecGroupStore::insert(RecGroupStore *this,RecGroup group)

{
  ulong *puVar1;
  HeapTypeKind HVar2;
  Shareability SVar3;
  pointer pFVar4;
  long *plVar5;
  _Hash_node_base *p_Var6;
  undefined8 *puVar7;
  ParentIndexIterator<const_wasm::RecGroup_*,_wasm::RecGroup::Iterator> PVar8;
  ParentIndexIterator<const_wasm::RecGroup_*,_wasm::RecGroup::Iterator> PVar9;
  bool bVar10;
  HeapTypeInfo *pHVar11;
  size_t sVar12;
  ulong uVar13;
  size_t sVar14;
  difference_type dVar15;
  difference_type dVar16;
  HeapTypeInfo *pHVar17;
  __hashtable_alloc *p_Var18;
  pointer __s;
  _Hash_node_base *p_Var19;
  size_type __n;
  HeapType HVar20;
  HeapType HVar21;
  pointer pFVar22;
  ulong uVar23;
  _Hash_node_base *p_Var24;
  size_t sVar25;
  long *plVar26;
  long *plVar27;
  const_iterator __begin2;
  ulong uVar28;
  pointer b;
  ulong uVar29;
  const_iterator __end2;
  long lVar30;
  ParentIndexIterator<const_wasm::RecGroup_*,_wasm::RecGroup::Iterator> PVar31;
  Iterator IVar32;
  undefined1 auVar33 [16];
  ulong local_98;
  ulong local_58;
  allocator_type local_41;
  undefined1 auStack_40 [7];
  __buckets_alloc_type __alloc;
  _Scoped_node __node;
  
  if (((ulong)this & 1) == 0) {
    uVar28 = *(long *)((long)&(this->mutex).super___mutex_base._M_mutex + 8) -
             (this->mutex).super___mutex_base._M_mutex.__align >> 3;
  }
  else {
    uVar28 = 1;
  }
  _auStack_40 = (RecGroup)(RecGroup)this;
  PVar31 = (ParentIndexIterator<const_wasm::RecGroup_*,_wasm::RecGroup::Iterator>)
           RecGroup::end((RecGroup *)auStack_40);
  local_98 = 0x9e3779b97f4a8c16;
  local_58 = 0x9e3779b97f4a7c16;
  for (sVar25 = 0; PVar8.index = sVar25, PVar8.parent = (RecGroup *)auStack_40,
      uVar23 = 0x9e3779b97f4a7c15, PVar31 != PVar8; sVar25 = sVar25 + 1) {
    if (((ulong)_auStack_40 & 1) == 0) {
      HVar20.id = *(uintptr_t *)(*(long *)_auStack_40 + sVar25 * 8);
    }
    else {
      HVar20.id = (ulong)_auStack_40 & 0xfffffffffffffffe;
    }
    if (HVar20.id < 0x7d) {
      uVar23 = HVar20.id + 0x9e3779b97f4a8c15;
    }
    else {
      pHVar11 = getHeapTypeInfo(HVar20);
      HVar21.id = (uintptr_t)pHVar11->supertype;
      uVar29 = uVar23;
      if (HVar21.id != 0) {
        uVar29 = local_98;
      }
      uVar29 = uVar29 ^ HVar21.id != 0;
      if (HVar21.id != 0) {
        sVar12 = RecGroupHasher::hash((RecGroupHasher *)auStack_40,HVar21);
        uVar29 = uVar29 ^ sVar12 + 0xa81af155173f24d6 + uVar29 * 0x1000;
      }
      HVar21.id = (uintptr_t)pHVar11->descriptor;
      uVar13 = local_58;
      if (HVar21.id == 0) {
        uVar13 = uVar23;
      }
      uVar29 = (uVar29 >> 4) + uVar29 * 0x1000 + uVar13 ^ uVar29;
      if (HVar21.id != 0) {
        sVar12 = RecGroupHasher::hash((RecGroupHasher *)auStack_40,HVar21);
        uVar29 = uVar29 ^ (uVar29 >> 4) + sVar12 + uVar29 * 0x1000 + -0x61c8864680b583eb;
      }
      HVar21.id = (uintptr_t)pHVar11->described;
      uVar13 = local_58;
      if (HVar21.id == 0) {
        uVar13 = uVar23;
      }
      uVar29 = (uVar29 >> 4) + uVar29 * 0x1000 + uVar13 ^ uVar29;
      if (HVar21.id != 0) {
        sVar12 = RecGroupHasher::hash((RecGroupHasher *)auStack_40,HVar21);
        uVar29 = uVar29 ^ (uVar29 >> 4) + sVar12 + uVar29 * 0x1000 + -0x61c8864680b583eb;
      }
      HVar2 = pHVar11->kind;
      if (3 < HVar2 - Func) {
        handle_unreachable("unexpected kind",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                           ,0x7fc);
      }
      bVar10 = pHVar11->isOpen;
      SVar3 = pHVar11->share;
      switch(HVar2) {
      case Func:
        sVar12 = RecGroupHasher::hash
                           ((RecGroupHasher *)auStack_40,
                            (Type)(pHVar11->field_9).signature.params.id);
        sVar14 = RecGroupHasher::hash
                           ((RecGroupHasher *)auStack_40,
                            (Type)(pHVar11->field_9).signature.results.id);
        sVar12 = (sVar12 >> 4) + sVar14 + sVar12 * 0x1000 + -0x61c8864680b583eb ^ sVar12;
        break;
      case Struct:
        pFVar22 = (pHVar11->field_9).struct_.fields.
                  super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pFVar4 = (pHVar11->field_9).struct_.fields.
                 super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        sVar12 = (long)pFVar4 - (long)pFVar22 >> 4;
        for (; pFVar22 != pFVar4; pFVar22 = pFVar22 + 1) {
          sVar14 = RecGroupHasher::hash((RecGroupHasher *)auStack_40,pFVar22);
          sVar12 = sVar12 ^ sVar12 * 0x1000 + -0x61c8864680b583eb + (sVar12 >> 4) + sVar14;
        }
        break;
      case Array:
        sVar12 = RecGroupHasher::hash
                           ((RecGroupHasher *)auStack_40,(Field *)&(pHVar11->field_9).signature);
        break;
      case Cont:
        sVar12 = RecGroupHasher::hash
                           ((RecGroupHasher *)auStack_40,
                            (HeapType)(pHVar11->field_9).signature.params.id);
        sVar12 = (sVar12 >> 4) + sVar12 * 0x1000 + 0x9e3779b97f567d2c ^ sVar12;
      }
      uVar29 = (uVar29 >> 4) + uVar29 * 0x1000 + -0x61c8864680b583eb + (ulong)bVar10 ^ uVar29;
      uVar29 = (uVar29 >> 4) + uVar29 * 0x1000 + (ulong)SVar3 + 0x9e3779b97f4a7c15 ^ uVar29;
      uVar29 = (uVar29 >> 4) + uVar29 * 0x1000 + (long)(int)HVar2 + -0x61c8864680b583eb ^ uVar29;
      uVar23 = (uVar29 * 0x1000 + -0x61c8864680b583eb + (uVar29 >> 4) + sVar12 ^ uVar29) +
               0x9e3779b97f4a7c15;
    }
    uVar28 = uVar28 ^ uVar28 * 0x1000 + -0x61c8864680b583eb + (uVar28 >> 4) +
                      (HVar20.id < 0x7d ^ uVar23);
  }
  uVar23 = uVar28 % (ulong)wasm::(anonymous_namespace)::globalRecGroupStore._48_8_;
  plVar27 = *(long **)(wasm::(anonymous_namespace)::globalRecGroupStore._40_8_ + uVar23 * 8);
  if (plVar27 != (long *)0x0) {
    uVar29 = ((long *)*plVar27)[2];
    plVar5 = (long *)*plVar27;
    do {
      plVar26 = plVar5;
      if (uVar29 == uVar28) {
        __node._M_h = (__hashtable_alloc *)plVar26[1];
        _auStack_40 = (RecGroup)(RecGroup)this;
        if ((RecGroupStore *)__node._M_h == this) {
LAB_00cfeaa1:
          if (*plVar27 != 0) {
            return (RecGroup)*(uintptr_t *)(*plVar27 + 8);
          }
          break;
        }
        PVar31 = (ParentIndexIterator<const_wasm::RecGroup_*,_wasm::RecGroup::Iterator>)
                 RecGroup::end((RecGroup *)auStack_40);
        IVar32 = RecGroup::end((RecGroup *)&__node);
        dVar15 = std::__distance<wasm::RecGroup::Iterator>(auStack_40,0,PVar31.parent,PVar31.index);
        dVar16 = std::__distance<wasm::RecGroup::Iterator>
                           (&__node,0,
                            IVar32.
                            super_ParentIndexIterator<const_wasm::RecGroup_*,_wasm::RecGroup::Iterator>
                            .parent,IVar32.
                                    super_ParentIndexIterator<const_wasm::RecGroup_*,_wasm::RecGroup::Iterator>
                                    .index);
        if (dVar15 == dVar16) {
          sVar25 = 0;
          do {
            PVar9.index = sVar25;
            PVar9.parent = (RecGroup *)auStack_40;
            if (PVar31 == PVar9) goto LAB_00cfeaa1;
            if (((ulong)_auStack_40 & 1) == 0) {
              HVar20.id = *(uintptr_t *)(*(long *)_auStack_40 + sVar25 * 8);
            }
            else {
              HVar20.id = (ulong)_auStack_40 & 0xfffffffffffffffe;
            }
            if (((ulong)__node._M_h & 1) == 0) {
              HVar21.id = *(uintptr_t *)(*(long *)__node._M_h + sVar25 * 8);
            }
            else {
              HVar21.id = (ulong)__node._M_h & 0xfffffffffffffffe;
            }
            if (HVar20.id != HVar21.id) {
              if ((HVar20.id < 0x7d) || (HVar21.id < 0x7d)) break;
              pHVar11 = getHeapTypeInfo(HVar20);
              pHVar17 = getHeapTypeInfo(HVar21);
              HVar20.id = (uintptr_t)pHVar11->supertype;
              if (((HVar20.id != 0) == (pHVar17->supertype == (HeapTypeInfo *)0x0)) ||
                 ((HVar20.id != 0 &&
                  (bVar10 = RecGroupEquator::eq((RecGroupEquator *)auStack_40,HVar20,
                                                (HeapType)pHVar17->supertype), !bVar10)))) break;
              HVar20.id = (uintptr_t)pHVar11->descriptor;
              if (((HVar20.id != 0) == (pHVar17->descriptor == (HeapTypeInfo *)0x0)) ||
                 ((HVar20.id != 0 &&
                  (bVar10 = RecGroupEquator::eq((RecGroupEquator *)auStack_40,HVar20,
                                                (HeapType)pHVar17->descriptor), !bVar10)))) break;
              HVar20.id = (uintptr_t)pHVar11->described;
              if (((HVar20.id != 0) == (pHVar17->described == (HeapTypeInfo *)0x0)) ||
                 ((((HVar20.id != 0 &&
                    (bVar10 = RecGroupEquator::eq((RecGroupEquator *)auStack_40,HVar20,
                                                  (HeapType)pHVar17->described), !bVar10)) ||
                   (pHVar11->isOpen != pHVar17->isOpen)) ||
                  ((pHVar11->share != pHVar17->share || (pHVar11->kind != pHVar17->kind)))))) break;
              switch(pHVar11->kind) {
              case Func:
                bVar10 = RecGroupEquator::eq((RecGroupEquator *)auStack_40,
                                             (Type)(pHVar11->field_9).signature.params.id,
                                             (Type)(pHVar17->field_9).signature.params.id);
                if (!bVar10) goto LAB_00cfea70;
                bVar10 = RecGroupEquator::eq((RecGroupEquator *)auStack_40,
                                             (Type)(pHVar11->field_9).signature.results.id,
                                             (Type)(pHVar17->field_9).signature.results.id);
                break;
              case Struct:
                pFVar22 = (pHVar11->field_9).struct_.fields.
                          super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pFVar4 = (pHVar11->field_9).struct_.fields.
                         super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                b = (pHVar17->field_9).struct_.fields.
                    super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                    super__Vector_impl_data._M_start;
                if ((long)pFVar4 - (long)pFVar22 ==
                    (long)(pHVar17->field_9).struct_.fields.
                          super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)b) {
                  for (; pFVar22 != pFVar4; pFVar22 = pFVar22 + 1) {
                    bVar10 = RecGroupEquator::eq((RecGroupEquator *)auStack_40,pFVar22,b);
                    if (!bVar10) goto LAB_00cfea70;
                    b = b + 1;
                  }
                  goto LAB_00cfea1a;
                }
                goto LAB_00cfea70;
              case Array:
                bVar10 = RecGroupEquator::eq((RecGroupEquator *)auStack_40,
                                             (Field *)&(pHVar11->field_9).signature,
                                             (Field *)&(pHVar17->field_9).signature);
                break;
              case Cont:
                bVar10 = RecGroupEquator::eq((RecGroupEquator *)auStack_40,
                                             (HeapType)(pHVar11->field_9).signature.params.id,
                                             (HeapType)(pHVar17->field_9).signature.params.id);
                break;
              default:
                handle_unreachable("unexpected kind",
                                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                                   ,0x895);
              }
              if (bVar10 == false) break;
            }
LAB_00cfea1a:
            sVar25 = sVar25 + 1;
          } while( true );
        }
      }
LAB_00cfea70:
      plVar5 = (long *)*plVar26;
      if ((plVar5 == (long *)0x0) ||
         (uVar29 = plVar5[2], plVar27 = plVar26,
         uVar29 % (ulong)wasm::(anonymous_namespace)::globalRecGroupStore._48_8_ != uVar23)) break;
    } while( true );
  }
  p_Var18 = (__hashtable_alloc *)operator_new(0x18);
  *(undefined8 *)p_Var18 = 0;
  *(RecGroupStore **)(p_Var18 + 8) = this;
  _auStack_40 = (RecGroup)0x1176508;
  __node._M_h = p_Var18;
  auVar33 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                      (0x1176528,wasm::(anonymous_namespace)::globalRecGroupStore._48_8_,
                       wasm::(anonymous_namespace)::globalRecGroupStore._64_8_);
  __n = auVar33._8_8_;
  if ((auVar33 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    if (__n == 1) {
      wasm::(anonymous_namespace)::globalRecGroupStore._88_8_ = 0;
      __s = (pointer)(wasm::(anonymous_namespace)::globalRecGroupStore + 0x58);
    }
    else {
      __s = std::allocator_traits<std::allocator<std::__detail::_Hash_node_base_*>_>::allocate
                      (&local_41,__n);
      memset(__s,0,__n * 8);
    }
    p_Var6 = (_Hash_node_base *)wasm::(anonymous_namespace)::globalRecGroupStore._56_8_;
    wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ = 0;
    uVar23 = 0;
LAB_00cfeb4d:
    p_Var24 = p_Var6;
    uVar29 = uVar23;
    if (p_Var24 != (_Hash_node_base *)0x0) {
      p_Var6 = p_Var24->_M_nxt;
      uVar23 = (ulong)p_Var24[2]._M_nxt % __n;
      if (__s[uVar23] == (_Hash_node_base *)0x0) goto LAB_00cfeb7c;
      p_Var24->_M_nxt = __s[uVar23]->_M_nxt;
      p_Var19 = __s[uVar23];
      uVar23 = uVar29;
      goto LAB_00cfeb9b;
    }
    std::
    _Hashtable<wasm::(anonymous_namespace)::RecGroupStructure,_wasm::(anonymous_namespace)::RecGroupStructure,_std::allocator<wasm::(anonymous_namespace)::RecGroupStructure>,_std::__detail::_Identity,_std::equal_to<wasm::(anonymous_namespace)::RecGroupStructure>,_std::hash<wasm::(anonymous_namespace)::RecGroupStructure>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::_M_deallocate_buckets
              ((_Hashtable<wasm::(anonymous_namespace)::RecGroupStructure,_wasm::(anonymous_namespace)::RecGroupStructure,_std::allocator<wasm::(anonymous_namespace)::RecGroupStructure>,_std::__detail::_Identity,_std::equal_to<wasm::(anonymous_namespace)::RecGroupStructure>,_std::hash<wasm::(anonymous_namespace)::RecGroupStructure>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)(wasm::(anonymous_namespace)::globalRecGroupStore + 0x28));
    uVar23 = uVar28 % __n;
    wasm::(anonymous_namespace)::globalRecGroupStore._40_8_ = __s;
    wasm::(anonymous_namespace)::globalRecGroupStore._48_8_ = __n;
  }
  lVar30 = wasm::(anonymous_namespace)::globalRecGroupStore._40_8_;
  *(ulong *)(p_Var18 + 0x10) = uVar28;
  puVar7 = *(undefined8 **)(lVar30 + uVar23 * 8);
  if (puVar7 == (undefined8 *)0x0) {
    *(undefined8 *)p_Var18 = wasm::(anonymous_namespace)::globalRecGroupStore._56_8_;
    if (wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ != 0) {
      puVar1 = (ulong *)(wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ + 0x10);
      wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ = p_Var18;
      *(__hashtable_alloc **)
       (lVar30 + (*puVar1 % (ulong)wasm::(anonymous_namespace)::globalRecGroupStore._48_8_) * 8) =
           p_Var18;
      lVar30 = wasm::(anonymous_namespace)::globalRecGroupStore._40_8_;
      p_Var18 = (__hashtable_alloc *)wasm::(anonymous_namespace)::globalRecGroupStore._56_8_;
    }
    wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ = p_Var18;
    *(undefined8 *)(lVar30 + uVar23 * 8) = 0x1176518;
  }
  else {
    *(undefined8 *)p_Var18 = *puVar7;
    **(undefined8 **)(lVar30 + uVar23 * 8) = p_Var18;
  }
  wasm::(anonymous_namespace)::globalRecGroupStore._64_8_ =
       wasm::(anonymous_namespace)::globalRecGroupStore._64_8_ + 1;
  __node._M_h = (__hashtable_alloc *)0x0;
  std::
  _Hashtable<wasm::(anonymous_namespace)::RecGroupStructure,_wasm::(anonymous_namespace)::RecGroupStructure,_std::allocator<wasm::(anonymous_namespace)::RecGroupStructure>,_std::__detail::_Identity,_std::equal_to<wasm::(anonymous_namespace)::RecGroupStructure>,_std::hash<wasm::(anonymous_namespace)::RecGroupStructure>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Scoped_node::~_Scoped_node((_Scoped_node *)auStack_40);
  return (RecGroup)(uintptr_t)this;
LAB_00cfeb7c:
  p_Var24->_M_nxt = (_Hash_node_base *)wasm::(anonymous_namespace)::globalRecGroupStore._56_8_;
  wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ = p_Var24;
  __s[uVar23] = (_Hash_node_base *)(wasm::(anonymous_namespace)::globalRecGroupStore + 0x38);
  if (p_Var24->_M_nxt != (_Hash_node_base *)0x0) {
    p_Var19 = (_Hash_node_base *)(__s + uVar29);
LAB_00cfeb9b:
    p_Var19->_M_nxt = p_Var24;
  }
  goto LAB_00cfeb4d;
}

Assistant:

RecGroup insert(RecGroup group) {
    RecGroupStructure structure{group};
    auto [it, inserted] = canonicalGroups.insert(structure);
    if (inserted) {
      return group;
    } else {
      return it->group;
    }
  }